

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

void __thiscall
duckdb::CatalogEntryMap::AddEntry
          (CatalogEntryMap *this,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *entry)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pCVar3;
  iterator iVar4;
  InternalException *this_00;
  string name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
  local_98;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pCVar3 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator->(entry);
  pcVar2 = (pCVar3->name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (pCVar3->name)._M_string_length);
  iVar4 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                  *)this,&local_70);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->entries)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_98.first.field_2;
    local_98.first._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    local_98.second.
    super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
    super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
    super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (entry->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
    (entry->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)._M_t
    .super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
    super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>,duckdb::CaseInsensitiveStringCompare,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>,duckdb::CaseInsensitiveStringCompare,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>>
                *)this,&local_98);
    if (local_98.second.
        super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
        super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
        super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true,_true>
         )0x0) {
      (*(*(_func_int ***)
          local_98.second.
          super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
          super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
          .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl)[1])();
    }
    local_98.second.
    super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
    super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
    super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_data<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true,_true>
          )0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_98.first._M_dataplus._M_p = (pointer)&local_98.first.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Entry with name \"%s\" already exists","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_98.first,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CatalogEntryMap::AddEntry(unique_ptr<CatalogEntry> entry) {
	auto name = entry->name;

	if (entries.find(name) != entries.end()) {
		throw InternalException("Entry with name \"%s\" already exists", name);
	}
	entries.insert(make_pair(name, std::move(entry)));
}